

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_ManPrint(Zyx_Man_t *p,int Iter,int iMint,int nLazyAll,abctime clk)

{
  uint uVar1;
  abctime time;
  undefined4 in_register_00000034;
  uint local_24;
  
  printf("Iter %6d : ",CONCAT44(in_register_00000034,Iter));
  Extra_PrintBinary(_stdout,&local_24,p->pPars->nVars);
  printf("  ");
  uVar1 = bmcg_sat_solver_clausenum(p->pSat);
  printf("Cla =%9d  ",(ulong)uVar1);
  printf("Lazy =%6d  ",(ulong)(uint)nLazyAll);
  uVar1 = bmcg_sat_solver_conflictnum(p->pSat);
  printf("Conf =%9d  ",(ulong)uVar1);
  Abc_PrintTime(0x82525c,(char *)clk,time);
  return;
}

Assistant:

static inline void Zyx_ManPrint( Zyx_Man_t * p, int Iter, int iMint, int nLazyAll, abctime clk )
{
    printf( "Iter %6d : ", Iter );
    Extra_PrintBinary( stdout, (unsigned *)&iMint, p->pPars->nVars );
    printf( "  " );
    printf( "Cla =%9d  ", bmcg_sat_solver_clausenum(p->pSat) );
    printf( "Lazy =%6d  ", nLazyAll );
    printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
    Abc_PrintTime( 1, "Time", clk );
    //Zyx_ManEvalStats( p );
    //Abc_PrintTime( 1, "Eval", p->clkEval );
}